

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.h
# Opt level: O3

void __thiscall dlib::affine_::affine_(affine_ *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  storage_heap sVar3;
  
  auVar1 = ZEXT816(0) << 0x40;
  auVar2 = ZEXT1632(auVar1);
  (this->params).super_tensor.m_n = auVar2._0_8_;
  (this->params).super_tensor.m_k = auVar2._8_8_;
  (this->params).super_tensor.m_nr = auVar2._16_8_;
  (this->params).super_tensor.m_nc = auVar2._24_8_;
  (this->params).super_tensor.m_size = 0;
  (this->params).data_instance.data_size = 0;
  (this->params).super_tensor._vptr_tensor = (_func_int **)&PTR__resizable_tensor_001fa340;
  (this->params).data_instance.host_current = true;
  (this->params).data_instance.device_current = true;
  (this->params).data_instance.have_active_transfer = false;
  (this->params).data_instance.device_in_use = false;
  (this->params).data_instance.data_host = (shared_ptr<float>)auVar2._0_16_;
  (this->params).data_instance.data_device = (shared_ptr<float>)auVar2._16_16_;
  sVar3 = (storage_heap)ZEXT1632(auVar1);
  *(storage_heap *)
   ((long)&(this->params).data_instance.data_device.
           super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4) = sVar3;
  (this->params)._annotation.storage = sVar3;
  (this->empty_params).super_tensor.m_n = (longlong)sVar3.ptr;
  (this->empty_params).super_tensor.m_k = (longlong)sVar3.del;
  (this->empty_params).super_tensor.m_nr = (longlong)sVar3.copy;
  (this->empty_params).super_tensor.m_nc = (longlong)sVar3.type_id_;
  (this->empty_params).super_tensor.m_size = 0;
  (this->empty_params).data_instance.data_size = 0;
  (this->empty_params).super_tensor._vptr_tensor = (_func_int **)&PTR__resizable_tensor_001fa340;
  (this->empty_params).data_instance.host_current = true;
  (this->empty_params).data_instance.device_current = true;
  (this->empty_params).data_instance.have_active_transfer = false;
  (this->empty_params).data_instance.device_in_use = false;
  (this->empty_params).data_instance.data_host.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)sVar3.ptr;
  (this->empty_params).data_instance.data_host.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount = (__shared_count<(__gnu_cxx::_Lock_policy)2>)sVar3.del;
  (this->empty_params).data_instance.data_device.
  super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)sVar3.copy;
  (this->empty_params).data_instance.data_device.
  super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
       (__shared_count<(__gnu_cxx::_Lock_policy)2>)sVar3.type_id_;
  sVar3 = (storage_heap)ZEXT1632(auVar1);
  *(storage_heap *)
   ((long)&(this->empty_params).data_instance.data_device.
           super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4) = sVar3;
  (this->empty_params)._annotation.storage = sVar3;
  (this->gamma).inst.super_tensor.m_n = (longlong)sVar3.ptr;
  (this->gamma).inst.super_tensor.m_k = (longlong)sVar3.del;
  (this->gamma).inst.super_tensor.m_nr = (longlong)sVar3.copy;
  (this->gamma).inst.super_tensor.m_nc = (longlong)sVar3.type_id_;
  (this->gamma).inst.super_tensor.m_size = 0;
  (this->gamma).inst.super_tensor._vptr_tensor = (_func_int **)&PTR__tensor_001fa490;
  (this->gamma).inst.data_offset = 0;
  (this->gamma).inst.data_instance = (gpu_data *)0x0;
  (this->gamma).inst._annotation = (any *)0x0;
  (this->beta).inst.super_tensor.m_n = (longlong)sVar3.ptr;
  (this->beta).inst.super_tensor.m_k = (longlong)sVar3.del;
  (this->beta).inst.super_tensor.m_nr = (longlong)sVar3.copy;
  (this->beta).inst.super_tensor.m_nc = (longlong)sVar3.type_id_;
  (this->beta).inst.super_tensor.m_size = 0;
  (this->beta).inst.super_tensor._vptr_tensor = (_func_int **)&PTR__tensor_001fa490;
  (this->beta).inst.data_instance = (gpu_data *)0x0;
  (this->beta).inst._annotation = (any *)0x0;
  (this->beta).inst.data_offset = 0;
  this->mode = FC_MODE;
  this->disabled = false;
  return;
}

Assistant:

tensor (
        ) : 
            m_n(0), m_k(0), m_nr(0), m_nc(0), m_size(0)
        {
        }